

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int TrellisQuantizeBlock
              (VP8Encoder *enc,int16_t *in,int16_t *out,int ctx0,int coeff_type,VP8Matrix *mtx,
              int lambda)

{
  uint8_t proba;
  byte bVar1;
  short sVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint iQ_00;
  uint32_t n_00;
  int iVar9;
  score_t sVar10;
  char *pcVar11;
  score_t sVar12;
  int in_ECX;
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  bool bVar13;
  int in_stack_00000008;
  int j_2;
  Node *node;
  int best_node;
  int nz;
  score_t last_pos_score;
  score_t last_pos_cost;
  int delta_error;
  int new_error;
  score_t score;
  score_t cost_1;
  int best_prev;
  score_t best_cur_score;
  score_t base_score;
  int band;
  int ctx;
  int level;
  Node *cur;
  ScoreState *tmp;
  int thresh_level;
  int level0;
  uint32_t coeff0;
  int sign;
  uint32_t B;
  uint32_t iQ;
  uint32_t Q;
  int j_1;
  score_t rate;
  int err;
  int j;
  int last_proba;
  int thresh;
  score_t cost;
  int last;
  int p;
  int m;
  int n;
  score_t best_score;
  int best_path [3];
  ScoreState *ss_prev;
  ScoreState *ss_cur;
  ScoreState score_states [2] [2];
  Node nodes [16] [2];
  int first;
  CostArrayPtr costs;
  ProbaArray *probas;
  int local_214;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1e8;
  int local_1b4;
  long local_1b0;
  int local_180;
  int local_17c;
  int local_140;
  int local_13c;
  int local_138;
  uint local_134;
  score_t local_130;
  undefined8 local_124;
  int local_11c;
  long *local_118;
  long *local_110;
  long local_108 [4];
  long alStack_e8 [4];
  char local_c8 [2];
  ushort auStack_c6 [65];
  uint local_44;
  long local_40;
  long local_38;
  long local_30;
  int local_28;
  int local_24;
  void *local_20;
  void *local_18;
  uint local_4;
  
  local_38 = in_RDI + 0xe24 + (long)in_R8D * 0x108;
  local_40 = in_RDI + 0x55c8 + (long)in_R8D * 0x180;
  local_44 = (uint)(in_R8D == 0);
  local_110 = local_108;
  local_118 = local_108 + 4;
  local_124 = 0xffffffffffffffff;
  local_11c = -1;
  proba = *(uint8_t *)(local_38 + (ulong)""[(int)local_44] * 0x21 + (long)in_ECX * 0xb);
  local_140 = local_44 - 1;
  local_134 = 0xf;
  do {
    if ((int)local_134 < (int)local_44) {
LAB_0017f5fb:
      if (local_140 < 0xf) {
        local_140 = local_140 + 1;
      }
      local_30 = in_R9;
      local_28 = in_R8D;
      local_24 = in_ECX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      iVar7 = VP8BitCost(0,proba);
      local_130 = RDScoreTrellis(in_stack_00000008,(long)iVar7,0);
      for (local_138 = 0; local_138 < 2; local_138 = local_138 + 1) {
        if (local_24 == 0) {
          local_1f8 = VP8BitCost(1,proba);
        }
        else {
          local_1f8 = 0;
        }
        sVar10 = RDScoreTrellis(in_stack_00000008,(long)local_1f8,0);
        local_110[(long)local_138 * 2] = sVar10;
        local_108[(long)local_138 * 2 + 1] =
             *(long *)(local_40 + (long)(int)local_44 * 0x18 + (long)local_24 * 8);
      }
      for (local_134 = local_44; plVar5 = local_110, plVar4 = local_118, (int)local_134 <= local_140
          ; local_134 = local_134 + 1) {
        uVar8 = (uint)""[(int)local_134];
        uVar6 = *(ushort *)(local_30 + (long)(int)uVar8 * 2);
        iQ_00 = (uint)*(ushort *)(local_30 + 0x20 + (long)(int)uVar8 * 2);
        bVar13 = *(short *)((long)local_18 + (long)(int)uVar8 * 2) < 0;
        if (bVar13) {
          local_1fc = -(int)*(short *)((long)local_18 + (long)(int)uVar8 * 2);
        }
        else {
          local_1fc = (int)*(short *)((long)local_18 + (long)(int)uVar8 * 2);
        }
        n_00 = local_1fc + (uint)*(ushort *)(local_30 + 0xc0 + (long)(int)uVar8 * 2);
        local_17c = QUANTDIV(n_00,iQ_00,0);
        local_180 = QUANTDIV(n_00,iQ_00,0x10000);
        if (0x7ff < local_180) {
          local_180 = 0x7ff;
        }
        if (0x7ff < local_17c) {
          local_17c = 0x7ff;
        }
        local_110 = local_118;
        local_118 = plVar5;
        for (local_138 = 0; local_138 < 2; local_138 = local_138 + 1) {
          pcVar11 = local_c8 + (long)local_138 * 4 + (long)(int)local_134 * 8;
          iVar7 = local_17c + local_138;
          local_200 = iVar7;
          if (2 < iVar7) {
            local_200 = 2;
          }
          bVar1 = ""[(int)(local_134 + 1)];
          plVar4[(long)local_138 * 2 + 1] =
               *(long *)(local_40 + (long)(int)(local_134 + 1) * 0x18 + (long)local_200 * 8);
          if ((iVar7 < 0) || (local_180 < iVar7)) {
            plVar4[(long)local_138 * 2] = 0x7fffffffffffff;
          }
          else {
            iVar9 = n_00 - iVar7 * (uint)uVar6;
            sVar10 = RDScoreTrellis(in_stack_00000008,0,
                                    (long)(int)((uint)kWeightTrellis[(int)uVar8] *
                                               (iVar9 * iVar9 - n_00 * n_00)));
            iVar9 = VP8LevelCost((uint16_t *)plVar5[1],iVar7);
            local_1b0 = *plVar5;
            sVar12 = RDScoreTrellis(in_stack_00000008,(long)iVar9,0);
            local_1b0 = local_1b0 + sVar12;
            local_1b4 = 0;
            for (local_13c = 1; local_13c < 2; local_13c = local_13c + 1) {
              iVar9 = VP8LevelCost((uint16_t *)plVar5[(long)local_13c * 2 + 1],iVar7);
              lVar3 = plVar5[(long)local_13c * 2];
              sVar12 = RDScoreTrellis(in_stack_00000008,(long)iVar9,0);
              if (lVar3 + sVar12 < local_1b0) {
                local_1b4 = local_13c;
                local_1b0 = lVar3 + sVar12;
              }
            }
            local_1b0 = sVar10 + local_1b0;
            pcVar11[1] = bVar13;
            *(short *)(pcVar11 + 2) = (short)iVar7;
            *pcVar11 = (char)local_1b4;
            plVar4[(long)local_138 * 2] = local_1b0;
            if ((iVar7 != 0) && (local_1b0 < local_130)) {
              if ((int)local_134 < 0xf) {
                local_214 = VP8BitCost(0,*(uint8_t *)
                                          (local_38 + (long)(int)(uint)bVar1 * 0x21 +
                                          (long)local_200 * 0xb));
              }
              else {
                local_214 = 0;
              }
              sVar10 = RDScoreTrellis(in_stack_00000008,(long)local_214,0);
              if (local_1b0 + sVar10 < local_130) {
                local_124 = CONCAT44(local_138,local_134);
                local_11c = local_1b4;
                local_130 = local_1b0 + sVar10;
              }
            }
          }
        }
      }
      if (local_28 == 0) {
        memset((void *)((long)local_18 + 2),0,0x1e);
        memset((void *)((long)local_20 + 2),0,0x1e);
      }
      else {
        memset(local_18,0,0x20);
        memset(local_20,0,0x20);
      }
      if ((int)local_124 == -1) {
        local_4 = 0;
      }
      else {
        uVar6 = 0;
        local_1e8 = local_124._4_4_;
        local_134 = (int)local_124;
        local_c8[(long)local_124._4_4_ * 4 + (long)(int)local_124 * 8] = (char)local_11c;
        for (; (int)local_44 <= (int)local_134; local_134 = local_134 + -1) {
          pcVar11 = local_c8 + (long)local_1e8 * 4 + (long)(int)local_134 * 8;
          bVar1 = ""[(int)local_134];
          if (pcVar11[1] == '\0') {
            sVar2 = *(short *)(pcVar11 + 2);
          }
          else {
            sVar2 = -*(short *)(pcVar11 + 2);
          }
          *(short *)((long)local_20 + (long)(int)local_134 * 2) = sVar2;
          uVar6 = *(ushort *)(pcVar11 + 2) | uVar6;
          *(short *)((long)local_18 + (long)(int)(uint)bVar1 * 2) =
               *(short *)((long)local_20 + (long)(int)local_134 * 2) *
               *(short *)(local_30 + (long)(int)(uint)bVar1 * 2);
          local_1e8 = (int)*pcVar11;
        }
        local_4 = (uint)(uVar6 != 0);
      }
      return local_4;
    }
    if ((int)((uint)*(ushort *)(in_R9 + 2) * (uint)*(ushort *)(in_R9 + 2)) / 4 <
        (int)*(short *)((long)in_RSI + (long)(int)(uint)""[(int)local_134] * 2) *
        (int)*(short *)((long)in_RSI + (long)(int)(uint)""[(int)local_134] * 2)) {
      local_140 = local_134;
      goto LAB_0017f5fb;
    }
    local_134 = local_134 + -1;
  } while( true );
}

Assistant:

static int TrellisQuantizeBlock(const VP8Encoder* WEBP_RESTRICT const enc,
                                int16_t in[16], int16_t out[16],
                                int ctx0, int coeff_type,
                                const VP8Matrix* WEBP_RESTRICT const mtx,
                                int lambda) {
  const ProbaArray* const probas = enc->proba_.coeffs_[coeff_type];
  CostArrayPtr const costs =
      (CostArrayPtr)enc->proba_.remapped_costs_[coeff_type];
  const int first = (coeff_type == TYPE_I16_AC) ? 1 : 0;
  Node nodes[16][NUM_NODES];
  ScoreState score_states[2][NUM_NODES];
  ScoreState* ss_cur = &SCORE_STATE(0, MIN_DELTA);
  ScoreState* ss_prev = &SCORE_STATE(1, MIN_DELTA);
  int best_path[3] = {-1, -1, -1};   // store best-last/best-level/best-previous
  score_t best_score;
  int n, m, p, last;

  {
    score_t cost;
    const int thresh = mtx->q_[1] * mtx->q_[1] / 4;
    const int last_proba = probas[VP8EncBands[first]][ctx0][0];

    // compute the position of the last interesting coefficient
    last = first - 1;
    for (n = 15; n >= first; --n) {
      const int j = kZigzag[n];
      const int err = in[j] * in[j];
      if (err > thresh) {
        last = n;
        break;
      }
    }
    // we don't need to go inspect up to n = 16 coeffs. We can just go up
    // to last + 1 (inclusive) without losing much.
    if (last < 15) ++last;

    // compute 'skip' score. This is the max score one can do.
    cost = VP8BitCost(0, last_proba);
    best_score = RDScoreTrellis(lambda, cost, 0);

    // initialize source node.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      const score_t rate = (ctx0 == 0) ? VP8BitCost(1, last_proba) : 0;
      ss_cur[m].score = RDScoreTrellis(lambda, rate, 0);
      ss_cur[m].costs = costs[first][ctx0];
    }
  }

  // traverse trellis.
  for (n = first; n <= last; ++n) {
    const int j = kZigzag[n];
    const uint32_t Q  = mtx->q_[j];
    const uint32_t iQ = mtx->iq_[j];
    const uint32_t B = BIAS(0x00);     // neutral bias
    // note: it's important to take sign of the _original_ coeff,
    // so we don't have to consider level < 0 afterward.
    const int sign = (in[j] < 0);
    const uint32_t coeff0 = (sign ? -in[j] : in[j]) + mtx->sharpen_[j];
    int level0 = QUANTDIV(coeff0, iQ, B);
    int thresh_level = QUANTDIV(coeff0, iQ, BIAS(0x80));
    if (thresh_level > MAX_LEVEL) thresh_level = MAX_LEVEL;
    if (level0 > MAX_LEVEL) level0 = MAX_LEVEL;

    {   // Swap current and previous score states
      ScoreState* const tmp = ss_cur;
      ss_cur = ss_prev;
      ss_prev = tmp;
    }

    // test all alternate level values around level0.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      Node* const cur = &NODE(n, m);
      const int level = level0 + m;
      const int ctx = (level > 2) ? 2 : level;
      const int band = VP8EncBands[n + 1];
      score_t base_score;
      score_t best_cur_score;
      int best_prev;
      score_t cost, score;

      ss_cur[m].costs = costs[n + 1][ctx];
      if (level < 0 || level > thresh_level) {
        ss_cur[m].score = MAX_COST;
        // Node is dead.
        continue;
      }

      {
        // Compute delta_error = how much coding this level will
        // subtract to max_error as distortion.
        // Here, distortion = sum of (|coeff_i| - level_i * Q_i)^2
        const int new_error = coeff0 - level * Q;
        const int delta_error =
            kWeightTrellis[j] * (new_error * new_error - coeff0 * coeff0);
        base_score = RDScoreTrellis(lambda, 0, delta_error);
      }

      // Inspect all possible non-dead predecessors. Retain only the best one.
      // The base_score is added to all scores so it is only added for the final
      // value after the loop.
      cost = VP8LevelCost(ss_prev[-MIN_DELTA].costs, level);
      best_cur_score =
          ss_prev[-MIN_DELTA].score + RDScoreTrellis(lambda, cost, 0);
      best_prev = -MIN_DELTA;
      for (p = -MIN_DELTA + 1; p <= MAX_DELTA; ++p) {
        // Dead nodes (with ss_prev[p].score >= MAX_COST) are automatically
        // eliminated since their score can't be better than the current best.
        cost = VP8LevelCost(ss_prev[p].costs, level);
        // Examine node assuming it's a non-terminal one.
        score = ss_prev[p].score + RDScoreTrellis(lambda, cost, 0);
        if (score < best_cur_score) {
          best_cur_score = score;
          best_prev = p;
        }
      }
      best_cur_score += base_score;
      // Store best finding in current node.
      cur->sign = sign;
      cur->level = level;
      cur->prev = best_prev;
      ss_cur[m].score = best_cur_score;

      // Now, record best terminal node (and thus best entry in the graph).
      if (level != 0 && best_cur_score < best_score) {
        const score_t last_pos_cost =
            (n < 15) ? VP8BitCost(0, probas[band][ctx][0]) : 0;
        const score_t last_pos_score = RDScoreTrellis(lambda, last_pos_cost, 0);
        score = best_cur_score + last_pos_score;
        if (score < best_score) {
          best_score = score;
          best_path[0] = n;                     // best eob position
          best_path[1] = m;                     // best node index
          best_path[2] = best_prev;             // best predecessor
        }
      }
    }
  }

  // Fresh start
  // Beware! We must preserve in[0]/out[0] value for TYPE_I16_AC case.
  if (coeff_type == TYPE_I16_AC) {
    memset(in + 1, 0, 15 * sizeof(*in));
    memset(out + 1, 0, 15 * sizeof(*out));
  } else {
    memset(in, 0, 16 * sizeof(*in));
    memset(out, 0, 16 * sizeof(*out));
  }
  if (best_path[0] == -1) {
    return 0;  // skip!
  }

  {
    // Unwind the best path.
    // Note: best-prev on terminal node is not necessarily equal to the
    // best_prev for non-terminal. So we patch best_path[2] in.
    int nz = 0;
    int best_node = best_path[1];
    n = best_path[0];
    NODE(n, best_node).prev = best_path[2];   // force best-prev for terminal

    for (; n >= first; --n) {
      const Node* const node = &NODE(n, best_node);
      const int j = kZigzag[n];
      out[n] = node->sign ? -node->level : node->level;
      nz |= node->level;
      in[j] = out[n] * mtx->q_[j];
      best_node = node->prev;
    }
    return (nz != 0);
  }
}